

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

uint __thiscall
crnlib::dxt1_endpoint_optimizer::color_distance
          (dxt1_endpoint_optimizer *this,bool perceptual,color_quad_u8 *e1,color_quad_u8 *e2,
          bool alpha)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int da;
  int yd;
  int y1;
  int y0;
  bool alpha_local;
  color_quad_u8 *e2_local;
  color_quad_u8 *e1_local;
  bool perceptual_local;
  dxt1_endpoint_optimizer *this_local;
  
  if (perceptual) {
    this_local._4_4_ = crnlib::color::color_distance(true,e1,e2,alpha);
  }
  else if ((this->m_pParams->m_grayscale_sampling & 1U) == 0) {
    this_local._4_4_ = crnlib::color::color_distance(false,e1,e2,alpha);
  }
  else {
    iVar3 = crnlib::color::RGB_to_Y(e1);
    iVar4 = crnlib::color::RGB_to_Y(e2);
    iVar3 = iVar3 - iVar4;
    if (alpha) {
      bVar1 = color_quad<unsigned_char,_int>::operator[](e1,3);
      bVar2 = color_quad<unsigned_char,_int>::operator[](e2,3);
      this_local._4_4_ = iVar3 * iVar3 + ((uint)bVar1 - (uint)bVar2) * ((uint)bVar1 - (uint)bVar2);
    }
    else {
      this_local._4_4_ = iVar3 * iVar3;
    }
  }
  return this_local._4_4_;
}

Assistant:

inline uint dxt1_endpoint_optimizer::color_distance(bool perceptual, const color_quad_u8& e1, const color_quad_u8& e2, bool alpha)
    {
        if (perceptual)
        {
            return color::color_distance(true, e1, e2, alpha);
        }
        else if (m_pParams->m_grayscale_sampling)
        {
            // Computes error assuming shader will be converting the result to grayscale.
            int y0 = color::RGB_to_Y(e1);
            int y1 = color::RGB_to_Y(e2);
            int yd = y0 - y1;
            if (alpha)
            {
                int da = (int)e1[3] - (int)e2[3];
                return yd * yd + da * da;
            }
            else
            {
                return yd * yd;
            }
        }
        else
        {
            return color::color_distance(false, e1, e2, alpha);
        }
    }